

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::handleUnderOverlay(QPDFJob *this,QPDF *pdf)

{
  string *key;
  element_type *peVar1;
  UnderOverlay *pUVar2;
  pointer pUVar3;
  Rectangle rect;
  int iVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  *v_out;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  *v_out_00;
  iterator __begin1;
  UnderOverlay *pUVar7;
  QPDFJob *this_00;
  long lVar8;
  size_t sVar9;
  UnderOverlay *underlay;
  allocator<char> local_2e9;
  string *local_2e8;
  ulong local_2e0;
  int pageno;
  reference local_2d0;
  string local_2c8;
  string content;
  undefined1 local_278 [16];
  string local_268;
  QPDFObjectHandle this_page_fo;
  QPDFObjectHandle resources;
  QPDFObjectHandle dest_page_oh;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  code *local_200;
  code *local_1f8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> main_pages;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  shared_ptr<Buffer> content_data;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  opages;
  vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
  upages;
  QPDFObjectHandle local_168;
  QPDFPageDocumentHelper main_pdh;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  overlay_pagenos;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  underlay_pagenos;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  Rectangle local_b0;
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  overlay_fo;
  map<int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
  underlay_fo;
  
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pUVar7 = (peVar1->underlay).
           super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>._M_impl
           .super__Vector_impl_data._M_start;
  pUVar2 = *(pointer *)
            ((long)&(peVar1->underlay).
                    super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                    ._M_impl.super__Vector_impl_data + 8);
  this_00 = this;
  local_2e8 = (string *)pdf;
  if ((pUVar7 != pUVar2) ||
     ((peVar1->overlay).
      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>._M_impl.
      super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar1->overlay).
               super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
               _M_impl.super__Vector_impl_data + 8))) {
    for (; pUVar7 != pUVar2; pUVar7 = pUVar7 + 1) {
      this_00 = this;
      validateUnderOverlay(this,(QPDF *)local_2e8,pUVar7);
    }
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pUVar2 = *(pointer *)
              ((long)&(peVar1->overlay).
                      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (pUVar7 = (peVar1->overlay).
                  super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>.
                  _M_impl.super__Vector_impl_data._M_start; pUVar7 != pUVar2; pUVar7 = pUVar7 + 1) {
      this_00 = this;
      validateUnderOverlay(this,(QPDF *)local_2e8,pUVar7);
    }
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         overlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         underlay_pagenos._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    getUOPagenos(this_00,&((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->underlay,&underlay_pagenos);
    getUOPagenos(this_00,&((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->overlay,&overlay_pagenos);
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c0 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:1998:17)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:1998:17)>
               ::_M_manager;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_d8);
    std::_Function_base::~_Function_base((_Function_base *)&local_d8);
    upages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    upages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    upages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    handleUnderOverlay::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->underlay,
               (vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *)&upages,
               v_out);
    opages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    opages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    opages.
    super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    handleUnderOverlay::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->overlay,
               (vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *)&opages,
               v_out_00);
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         overlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         underlay_fo._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&main_pdh,(QPDF *)local_2e8);
    QPDFPageDocumentHelper::getAllPages(&main_pages,&main_pdh);
    local_2e0 = 0;
    while( true ) {
      if ((ulong)(((long)main_pages.
                         super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)main_pages.
                        super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= local_2e0) break;
      iVar4 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert(&local_2e0);
      pageno = iVar4 + 1;
      local_210._8_8_ = 0;
      local_1f8 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2023:13)>
                  ::_M_invoke;
      local_200 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2023:13)>
                  ::_M_manager;
      local_210._M_allocated_capacity = (size_type)&pageno;
      doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_210);
      std::_Function_base::~_Function_base((_Function_base *)&local_210);
      pmVar5 = std::
               map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
               ::operator[](&underlay_pagenos,&pageno);
      if (((pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) ||
         (pmVar5 = std::
                   map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                   ::operator[](&overlay_pagenos,&pageno),
         (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        pvVar6 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                           (&main_pages,local_2e0);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dest_page_oh,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &(pvVar6->super_QPDFObjectHelper).super_BaseHandle);
        QPDFPageObjectHelper::getFormXObjectForPage
                  ((QPDFPageObjectHelper *)&this_page_fo,SUB81(pvVar6,0));
        local_2d0 = pvVar6;
        QPDFObjectHandle::getRawStreamData
                  ((QPDFObjectHandle *)
                   &content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1c8,&content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
        content._M_dataplus._M_p = (pointer)0x0;
        content._M_string_length = 0;
        local_2c8._M_dataplus._M_p = (pointer)0x0;
        local_2c8._M_string_length = 0;
        QPDFObjectHandle::replaceStreamData
                  (&this_page_fo,(shared_ptr<Buffer> *)&local_1c8,(QPDFObjectHandle *)&content,
                   (QPDFObjectHandle *)&local_2c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&content._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8._M_refcount);
        key = (string *)(local_278 + 0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&content,"/Resources",(allocator<char> *)key);
        operator____qpdf((char *)&local_2c8,0x21624b);
        QPDFObjectHandle::replaceKeyAndGetNew
                  (&resources,(string *)&dest_page_oh,(QPDFObjectHandle *)&content);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8._M_string_length);
        std::__cxx11::string::~string((string *)&content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&content,"/XObject",(allocator<char> *)local_278);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)key,(string *)&resources);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"/Fx0",&local_2e9);
        QPDFObjectHandle::replaceKeyAndGetNew(&local_168,key,(QPDFObjectHandle *)&local_2c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_168.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268._M_string_length);
        std::__cxx11::string::~string((string *)&content);
        content._M_dataplus._M_p = (pointer)&content.field_2;
        content._M_string_length = 0;
        content.field_2._M_local_buf[0] = '\0';
        peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pUVar3 = *(pointer *)
                  ((long)&(peVar1->underlay).
                          super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                          ._M_impl.super__Vector_impl_data + 8);
        lVar8 = 0;
        sVar9 = 0;
        for (pUVar7 = (peVar1->underlay).
                      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                      ._M_impl.super__Vector_impl_data._M_start; pUVar7 != pUVar3;
            pUVar7 = pUVar7 + 1) {
          doUnderOverlayForPage_abi_cxx11_
                    (&local_2c8,this,(QPDF *)local_2e8,pUVar7,&underlay_pagenos,local_2e0,sVar9,
                     &underlay_fo,
                     (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     ((long)&((upages.
                               super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar8),local_2d0);
          std::__cxx11::string::append((string *)&content);
          std::__cxx11::string::~string((string *)&local_2c8);
          sVar9 = sVar9 + 1;
          lVar8 = lVar8 + 0x18;
        }
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1d8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this_page_fo)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_278 + 0x10),"/Fx0",&local_2e9);
        QPDFPageObjectHelper::getMediaBox((QPDFPageObjectHelper *)local_278,SUB81(local_2d0,0));
        QPDFObjectHandle::getArrayAsRectangle(&local_b0,(QPDFObjectHandle *)local_278);
        rect.lly = local_b0.lly;
        rect.llx = local_b0.llx;
        rect.urx = local_b0.urx;
        rect.ury = local_b0.ury;
        QPDFPageObjectHelper::placeFormXObject
                  (&local_2c8,local_2d0,(QPDFObjectHandle *)&local_1d8,(string *)(local_278 + 0x10),
                   rect,true,false,false);
        std::__cxx11::string::append((string *)&content);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8));
        std::__cxx11::string::~string((string *)(local_278 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
        peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pUVar3 = *(pointer *)
                  ((long)&(peVar1->overlay).
                          super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                          ._M_impl.super__Vector_impl_data + 8);
        lVar8 = 0;
        sVar9 = 0;
        for (pUVar7 = (peVar1->overlay).
                      super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                      ._M_impl.super__Vector_impl_data._M_start; pUVar7 != pUVar3;
            pUVar7 = pUVar7 + 1) {
          doUnderOverlayForPage_abi_cxx11_
                    (&local_2c8,this,(QPDF *)local_2e8,pUVar7,&overlay_pagenos,local_2e0,sVar9,
                     &overlay_fo,
                     (vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                     ((long)&((opages.
                               super__Vector_base<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar8),local_2d0);
          std::__cxx11::string::append((string *)&content);
          std::__cxx11::string::~string((string *)&local_2c8);
          sVar9 = sVar9 + 1;
          lVar8 = lVar8 + 0x18;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c8,"/Contents",(allocator<char> *)local_278);
        QPDF::newStream((QPDF *)(local_278 + 0x10),local_2e8);
        QPDFObjectHandle::replaceKey
                  (&dest_page_oh,&local_2c8,(QPDFObjectHandle *)(local_278 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268._M_string_length);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&content);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&resources.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&content_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&this_page_fo.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&dest_page_oh.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      local_2e0 = local_2e0 + 1;
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&main_pages);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&main_pdh);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
    ::~_Rb_tree(&overlay_fo._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_QPDFObjectHandle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFObjectHandle>_>_>_>_>_>
    ::~_Rb_tree(&underlay_fo._M_t);
    std::
    vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ::~vector(&opages);
    std::
    vector<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>,_std::allocator<std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>_>
    ::~vector(&upages);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
    ::~_Rb_tree(&overlay_pagenos._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
    ::~_Rb_tree(&underlay_pagenos._M_t);
  }
  return;
}

Assistant:

void
QPDFJob::handleUnderOverlay(QPDF& pdf)
{
    if (m->underlay.empty() && m->overlay.empty()) {
        return;
    }
    for (auto& uo: m->underlay) {
        validateUnderOverlay(pdf, &uo);
    }
    for (auto& uo: m->overlay) {
        validateUnderOverlay(pdf, &uo);
    }

    // First map key is 1-based page number. Second is index into the overlay/underlay vector. Watch
    // out to not reverse the keys or be off by one.
    std::map<int, std::map<size_t, std::vector<int>>> underlay_pagenos;
    std::map<int, std::map<size_t, std::vector<int>>> overlay_pagenos;
    getUOPagenos(m->underlay, underlay_pagenos);
    getUOPagenos(m->overlay, overlay_pagenos);
    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": processing underlay/overlay\n";
    });

    auto get_pages = [](std::vector<UnderOverlay>& v,
                        std::vector<std::vector<QPDFPageObjectHelper>>& v_out) {
        for (auto const& uo: v) {
            if (uo.pdf) {
                v_out.push_back(QPDFPageDocumentHelper(*(uo.pdf)).getAllPages());
            }
        }
    };
    std::vector<std::vector<QPDFPageObjectHelper>> upages;
    get_pages(m->underlay, upages);
    std::vector<std::vector<QPDFPageObjectHelper>> opages;
    get_pages(m->overlay, opages);

    std::map<int, std::map<size_t, QPDFObjectHandle>> underlay_fo;
    std::map<int, std::map<size_t, QPDFObjectHandle>> overlay_fo;
    QPDFPageDocumentHelper main_pdh(pdf);
    auto main_pages = main_pdh.getAllPages();
    size_t main_npages = main_pages.size();
    for (size_t page_idx = 0; page_idx < main_npages; ++page_idx) {
        auto pageno = QIntC::to_int(page_idx) + 1;
        doIfVerbose(
            [&](Pipeline& v, std::string const& prefix) { v << "  page " << pageno << "\n"; });
        if (underlay_pagenos[pageno].empty() && overlay_pagenos[pageno].empty()) {
            continue;
        }
        // This code converts the original page, any underlays, and any overlays to form XObjects.
        // Then it concatenates display of all underlays, the original page, and all overlays. Prior
        // to 11.3.0, the original page contents were wrapped in q/Q, but this didn't work if the
        // original page had unbalanced q/Q operators. See GitHub issue #904.
        auto& dest_page = main_pages.at(page_idx);
        auto dest_page_oh = dest_page.getObjectHandle();
        auto this_page_fo = dest_page.getFormXObjectForPage();
        // The resulting form xobject lazily reads the content from the original page, which we are
        // going to replace. Therefore, we have to explicitly copy it.
        auto content_data = this_page_fo.getRawStreamData();
        this_page_fo.replaceStreamData(content_data, QPDFObjectHandle(), QPDFObjectHandle());
        auto resources =
            dest_page_oh.replaceKeyAndGetNew("/Resources", "<< /XObject << >> >>"_qpdf);
        resources.getKey("/XObject").replaceKeyAndGetNew("/Fx0", this_page_fo);
        size_t uo_idx{0};
        std::string content;
        for (auto& underlay: m->underlay) {
            content += doUnderOverlayForPage(
                pdf,
                underlay,
                underlay_pagenos,
                page_idx,
                uo_idx,
                underlay_fo,
                upages[uo_idx],
                dest_page);
            ++uo_idx;
        }
        content += dest_page.placeFormXObject(
            this_page_fo,
            "/Fx0",
            dest_page.getMediaBox().getArrayAsRectangle(),
            true,
            false,
            false);
        uo_idx = 0;
        for (auto& overlay: m->overlay) {
            content += doUnderOverlayForPage(
                pdf,
                overlay,
                overlay_pagenos,
                page_idx,
                uo_idx,
                overlay_fo,
                opages[uo_idx],
                dest_page);
            ++uo_idx;
        }
        dest_page_oh.replaceKey("/Contents", pdf.newStream(content));
    }
}